

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O0

Var __thiscall
Js::DynamicTypeHandler::GetInlineSlot(DynamicTypeHandler *this,DynamicObject *instance,int index)

{
  ushort uVar1;
  _func_int **ptr;
  code *pcVar2;
  bool bVar3;
  uint16 uVar4;
  undefined4 *puVar5;
  Var value;
  Var *slots;
  int index_local;
  DynamicObject *instance_local;
  DynamicTypeHandler *this_local;
  
  if (index < (int)(uint)(this->offsetOfInlineSlots >> 3)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x67,"(index >= (int)(offsetOfInlineSlots / sizeof(Var)))",
                                "index should be relative to the address of the object");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar1 = this->offsetOfInlineSlots;
  uVar4 = GetInlineSlotCapacity(this);
  if ((int)(uint)uVar4 <= (int)(index - (uint)(uVar1 >> 3))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x68,
                                "(index - (int)(offsetOfInlineSlots / sizeof(Var)) < this->GetInlineSlotCapacity())"
                                ,
                                "index - (int)(offsetOfInlineSlots / sizeof(Var)) < this->GetInlineSlotCapacity()"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ptr = (&(instance->super_RecyclableObject).super_FinalizableObject)[index].
        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
  bVar3 = ThreadContext::IsOnStack(instance);
  if (((!bVar3) && (bVar3 = ThreadContext::IsOnStack(ptr), bVar3)) &&
     (bVar3 = TaggedNumber::Is(ptr), !bVar3)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x6b,
                                "(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value))"
                                ,
                                "ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value)"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  return ptr;
}

Assistant:

Var DynamicTypeHandler::GetInlineSlot(DynamicObject * instance, int index)
    {
        AssertMsg(index >= (int)(offsetOfInlineSlots / sizeof(Var)), "index should be relative to the address of the object");
        Assert(index - (int)(offsetOfInlineSlots / sizeof(Var)) < this->GetInlineSlotCapacity());
        Var * slots = reinterpret_cast<Var*>(instance);
        Var value = slots[index];
        Assert(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value));
        return value;
    }